

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

void duckdb::TimeBucketFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  interval_t bucket_width_00;
  VectorType VVar1;
  bool bVar2;
  interval_t *piVar3;
  NotImplementedException *this;
  Vector *in_RDX;
  DataChunk *in_RDI;
  BucketWidthType bucket_width_type;
  interval_t bucket_width;
  value_type *ts_arg;
  value_type *bucket_width_arg;
  idx_t in_stack_fffffffffffffef8;
  Vector *in_stack_ffffffffffffff00;
  Vector *result_00;
  Vector *in_stack_ffffffffffffff08;
  reference right;
  Vector *in_stack_ffffffffffffff10;
  allocator local_79;
  string local_78 [32];
  undefined8 local_58;
  int64_t iStack_50;
  BucketWidthType local_39;
  undefined8 local_38;
  int64_t iStack_30;
  reference local_28;
  Vector *local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff00,
                        in_stack_fffffffffffffef8);
  local_28 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff00,
                        in_stack_fffffffffffffef8);
  VVar1 = Vector::GetVectorType(local_20);
  if (VVar1 == CONSTANT_VECTOR) {
    bVar2 = ConstantVector::IsNull((Vector *)0xbe3c94);
    if (bVar2) {
      duckdb::Vector::SetVectorType((VectorType)local_18);
      duckdb::ConstantVector::SetNull(local_18,true);
    }
    else {
      piVar3 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0xbe3cd0);
      local_58._0_4_ = piVar3->months;
      local_58._4_4_ = piVar3->days;
      iStack_50 = piVar3->micros;
      bucket_width_00.micros = in_stack_fffffffffffffef8;
      bucket_width_00.months = 0xbe3d00;
      bucket_width_00.days = 0;
      local_38 = local_58;
      iStack_30 = iStack_50;
      local_39 = TimeBucket::ClassifyBucketWidth(bucket_width_00);
      if (local_39 == CONVERTIBLE_TO_MICROS) {
        DataChunk::size(local_8);
        BinaryExecutor::
        Execute<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t)>
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,(_func_timestamp_t_interval_t_timestamp_t *)0xbe3d85);
      }
      else if (local_39 == CONVERTIBLE_TO_MONTHS) {
        DataChunk::size(local_8);
        BinaryExecutor::
        Execute<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t)>
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,(_func_timestamp_t_interval_t_timestamp_t *)0xbe3ddc);
      }
      else {
        if (local_39 != UNCLASSIFIED) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_78,"Bucket type not implemented for TIME_BUCKET",&local_79);
          duckdb::NotImplementedException::NotImplementedException(this,local_78);
          __cxa_throw(this,&NotImplementedException::typeinfo,
                      NotImplementedException::~NotImplementedException);
        }
        DataChunk::size(local_8);
        BinaryExecutor::
        Execute<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t)>
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,(_func_timestamp_t_interval_t_timestamp_t *)0xbe3e33);
      }
    }
  }
  else {
    result_00 = local_20;
    right = local_28;
    DataChunk::size(local_8);
    BinaryExecutor::
    Execute<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t)>
              (local_18,right,result_00,in_stack_fffffffffffffef8,
               (_func_timestamp_t_interval_t_timestamp_t *)0xbe3f58);
  }
  return;
}

Assistant:

static void TimeBucketFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				BinaryExecutor::Execute<interval_t, T, T>(
				    bucket_width_arg, ts_arg, result, args.size(),
				    TimeBucket::WidthConvertibleToMicrosBinaryOperator::Operation<interval_t, T, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				BinaryExecutor::Execute<interval_t, T, T>(
				    bucket_width_arg, ts_arg, result, args.size(),
				    TimeBucket::WidthConvertibleToMonthsBinaryOperator::Operation<interval_t, T, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				BinaryExecutor::Execute<interval_t, T, T>(bucket_width_arg, ts_arg, result, args.size(),
				                                          TimeBucket::BinaryOperator::Operation<interval_t, T, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		BinaryExecutor::Execute<interval_t, T, T>(bucket_width_arg, ts_arg, result, args.size(),
		                                          TimeBucket::BinaryOperator::Operation<interval_t, T, T>);
	}
}